

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImFont *pIVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  ImU32 IVar6;
  char *text_end_00;
  float fVar7;
  bool local_a1;
  ImVec2 *local_a0;
  undefined1 local_8c [8];
  ImVec4 fine_clip_rect;
  bool need_clipping;
  ImVec2 *clip_max;
  ImVec2 *clip_min;
  ImVec2 text_size;
  ImVec2 pos;
  ImGuiWindow *window;
  ImGuiContext *g;
  int text_len;
  char *text_display_end;
  ImVec2 *align_local;
  ImVec2 *text_size_if_known_local;
  char *text_end_local;
  char *text_local;
  ImVec2 *pos_max_local;
  ImVec2 *pos_min_local;
  
  text_end_00 = FindRenderedTextEnd(text,text_end);
  pIVar5 = GImGui;
  if ((int)text_end_00 != (int)text) {
    pIVar1 = GImGui->CurrentWindow;
    text_size = *pos_min;
    if (text_size_if_known == (ImVec2 *)0x0) {
      clip_min = (ImVec2 *)CalcTextSize(text,text_end_00,false,0.0);
    }
    else {
      clip_min = *(ImVec2 **)text_size_if_known;
    }
    local_a0 = pos_max;
    if (clip_rect != (ImRect *)0x0) {
      local_a0 = &clip_rect->Max;
      pos_min = &clip_rect->Min;
    }
    stack0xffffffffffffff88 = local_a0;
    local_a1 = true;
    if (text_size.x + clip_min._0_4_ < local_a0->x) {
      local_a1 = local_a0->y <= text_size.y + clip_min._4_4_;
    }
    fine_clip_rect.z._3_1_ = local_a1;
    if (clip_rect != (ImRect *)0x0) {
      bVar4 = true;
      if ((((ImRect *)pos_min)->Min).x <= text_size.x) {
        bVar4 = text_size.y < (((ImRect *)pos_min)->Min).y;
      }
      fine_clip_rect.z._3_1_ = local_a1 != false || bVar4;
    }
    if (0.0 < align->x) {
      fVar7 = ImMax<float>(text_size.x,
                           ((pos_max->x - text_size.x) - clip_min._0_4_) * align->x + text_size.x);
      text_size.x = fVar7;
    }
    if (0.0 < align->y) {
      fVar7 = ImMax<float>(text_size.y,
                           ((pos_max->y - text_size.y) - clip_min._4_4_) * align->y + text_size.y);
      text_size.y = fVar7;
    }
    if ((fine_clip_rect.z._3_1_ & 1) == 0) {
      pIVar2 = pIVar1->DrawList;
      pIVar3 = pIVar5->Font;
      fVar7 = pIVar5->FontSize;
      IVar6 = GetColorU32(0,1.0);
      ImDrawList::AddText(pIVar2,pIVar3,fVar7,&text_size,IVar6,text,text_end_00,0.0,(ImVec4 *)0x0);
    }
    else {
      ImVec4::ImVec4((ImVec4 *)local_8c,(((ImRect *)pos_min)->Min).x,(((ImRect *)pos_min)->Min).y,
                     stack0xffffffffffffff88->x,stack0xffffffffffffff88->y);
      pIVar2 = pIVar1->DrawList;
      pIVar3 = pIVar5->Font;
      fVar7 = pIVar5->FontSize;
      IVar6 = GetColorU32(0,1.0);
      ImDrawList::AddText(pIVar2,pIVar3,fVar7,&text_size,IVar6,text,text_end_00,0.0,
                          (ImVec4 *)local_8c);
    }
    if ((pIVar5->LogEnabled & 1U) != 0) {
      LogRenderedText(&text_size,text,text_end_00);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
    if (g.LogEnabled)
        LogRenderedText(&pos, text, text_display_end);
}